

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_1412e7::readFirstPart(string *fn)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int y1;
  int iVar5;
  int x2;
  int y2;
  int iVar6;
  int width;
  int iVar7;
  int iVar8;
  int type;
  int iVar9;
  int iVar10;
  int iVar11;
  ostream *this;
  reference pvVar12;
  int extraout_var;
  uint *puVar13;
  DeepFrameBuffer *in_stack_00000028;
  DeepFrameBuffer *in_stack_00000030;
  DeepScanLineInputFile *in_stack_00000038;
  FrameBuffer *in_stack_00000058;
  TiledInputFile *in_stack_00000060;
  Box2i b2_1;
  Box2i b1_1;
  int in_stack_0000014c;
  int in_stack_00000150;
  int in_stack_00000154;
  int in_stack_00000158;
  int in_stack_0000015c;
  DeepTiledInputFile *in_stack_00000160;
  int in_stack_00000170;
  DeepFrameBuffer frameBuffer_3;
  int numYTiles_1;
  int numXTiles_1;
  int h_1;
  int w_1;
  int ly_1;
  int lx_1;
  int ty2_1;
  int ty1_1;
  int tx2_1;
  int tx1_1;
  int numYLevels_1;
  int numXLevels_1;
  DeepTiledInputFile part_3;
  int l2_1;
  int l1_1;
  DeepFrameBuffer frameBuffer_2;
  DeepScanLineInputFile part_2;
  Box2i b2;
  Box2i b1;
  FrameBuffer frameBuffer_1;
  int numYTiles;
  int numXTiles;
  int h;
  int w;
  int numYLevels;
  int numXLevels;
  int ly;
  int lx;
  int ty2;
  int ty1;
  int tx2;
  int tx1;
  TiledInputFile part_1;
  FrameBuffer frameBuffer;
  int l2;
  int l1;
  InputFile part;
  int levelMode;
  int partType;
  int pixelType;
  Array2D<unsigned_int> sampleCount;
  Array2D<half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  Array2D<half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  int in_stack_00000b54;
  int in_stack_00000b58;
  int in_stack_00000b5c;
  int in_stack_00000b60;
  int in_stack_00000b64;
  DeepTiledInputFile *in_stack_00000b68;
  int in_stack_00000b80;
  int in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  int in_stack_fffffffffffffb88;
  int iVar14;
  int y2_00;
  int in_stack_fffffffffffffb8c;
  int in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  undefined1 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb99;
  undefined1 in_stack_fffffffffffffb9a;
  undefined1 in_stack_fffffffffffffb9b;
  int in_stack_fffffffffffffb9c;
  int in_stack_fffffffffffffba0;
  undefined4 uVar15;
  int in_stack_fffffffffffffba4;
  PixelType t;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  int in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc4;
  int in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffc5c;
  undefined1 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc61;
  undefined1 in_stack_fffffffffffffc62;
  undefined1 in_stack_fffffffffffffc63;
  undefined4 in_stack_fffffffffffffc64;
  Array2D<float_*> *in_stack_fffffffffffffc68;
  Array2D<float> *fData_00;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  undefined8 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  value_type vVar16;
  int local_354;
  Slice local_340 [2];
  int in_stack_fffffffffffffd3c;
  DeepTiledInputFile *in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd4c;
  DeepTiledInputFile *in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  int in_stack_fffffffffffffd80;
  int dy;
  int in_stack_fffffffffffffd84;
  int dx;
  undefined4 in_stack_fffffffffffffd88;
  int iVar17;
  undefined4 in_stack_fffffffffffffd8c;
  DeepTiledInputFile local_270;
  int local_260;
  int in_stack_fffffffffffffda4;
  PixelType in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  char *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  char *in_stack_fffffffffffffdc8;
  InputFile *in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  DeepScanLineInputFile *in_stack_fffffffffffffde0;
  FrameBuffer *in_stack_fffffffffffffe38;
  InputFile *in_stack_fffffffffffffe40;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  TiledInputFile local_128;
  Array2D<float> local_118 [2];
  int local_e8;
  int local_e4 [6];
  value_type local_cc;
  value_type local_c8;
  value_type local_c4;
  Array2D<unsigned_int> local_c0;
  int in_stack_ffffffffffffff64;
  half **in_stack_ffffffffffffff68;
  DeepScanLineInputFile *in_stack_ffffffffffffff70;
  Array2D<unsigned_int_*> local_78;
  Array2D<half> local_60;
  Array2D<float> local_38;
  Array2D<unsigned_int> local_20;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  Imf_2_5::Array2D<unsigned_int>::Array2D(&local_20);
  Imf_2_5::Array2D<float>::Array2D(&local_38);
  Imf_2_5::Array2D<half>::Array2D(&local_60);
  Imf_2_5::Array2D<unsigned_int_*>::Array2D(&local_78);
  Imf_2_5::Array2D<float_*>::Array2D((Array2D<float_*> *)&stack0xffffffffffffff70);
  Imf_2_5::Array2D<half_*>::Array2D((Array2D<half_*> *)&stack0xffffffffffffff58);
  Imf_2_5::Array2D<unsigned_int>::Array2D(&local_c0);
  this = std::operator<<((ostream *)&std::cout,"Reading first part ");
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,0);
  local_c4 = *pvVar12;
  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,0);
  local_c8 = *pvVar12;
  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::levelModes,0);
  local_cc = *pvVar12;
  switch(local_c8) {
  case 0:
    vVar16 = local_c8;
    std::__cxx11::string::c_str();
    iVar4 = extraout_var;
    iVar14 = Imf_2_5::globalThreadCount();
    Imf_2_5::InputFile::InputFile
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4);
    iVar2 = random_int(in_stack_fffffffffffffb84);
    local_e4[0] = iVar2;
    iVar3 = random_int(in_stack_fffffffffffffb84);
    local_e8 = iVar3;
    if (iVar3 < local_e4[0]) {
      std::swap<int>(local_e4,&local_e8);
    }
    fData_00 = local_118;
    Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1c1fcc);
    setInputFrameBuffer((FrameBuffer *)CONCAT44(iVar14,in_stack_fffffffffffffc80),iVar4,
                        (Array2D<unsigned_int> *)CONCAT44(iVar2,iVar3),fData_00,
                        (Array2D<half> *)
                        CONCAT44(in_stack_fffffffffffffc64,
                                 CONCAT13(in_stack_fffffffffffffc63,
                                          CONCAT12(in_stack_fffffffffffffc62,
                                                   CONCAT11(in_stack_fffffffffffffc61,
                                                            in_stack_fffffffffffffc60)))),
                        in_stack_fffffffffffffc5c,vVar16);
    Imf_2_5::InputFile::setFrameBuffer(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    Imf_2_5::InputFile::readPixels
              ((InputFile *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb9c,
               CONCAT13(in_stack_fffffffffffffb9b,
                        CONCAT12(in_stack_fffffffffffffb9a,
                                 CONCAT11(in_stack_fffffffffffffb99,in_stack_fffffffffffffb98))));
    if (local_c4 == 0) {
      bVar1 = checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffb9c,
                                  CONCAT13(in_stack_fffffffffffffb9b,
                                           CONCAT12(in_stack_fffffffffffffb9a,
                                                    CONCAT11(in_stack_fffffffffffffb99,
                                                             in_stack_fffffffffffffb98)))),
                         in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                         in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb84);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int>(uData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                      ,0x3a3,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (local_c4 == 1) {
      bVar1 = checkPixels<float>((Array2D<float> *)
                                 CONCAT44(in_stack_fffffffffffffb9c,
                                          CONCAT13(in_stack_fffffffffffffb9b,
                                                   CONCAT12(in_stack_fffffffffffffb9a,
                                                            CONCAT11(in_stack_fffffffffffffb99,
                                                                     in_stack_fffffffffffffb98)))),
                                 in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                                 in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
                                 in_stack_fffffffffffffb84);
      if (!bVar1) {
        __assert_fail("checkPixels<float>(fData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                      ,0x3a6,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((local_c4 == 2) &&
            (bVar1 = checkPixels<half>((Array2D<half> *)
                                       CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                                       ,in_stack_fffffffffffffba4,in_stack_fffffffffffffba0,
                                       in_stack_fffffffffffffb9c,
                                       CONCAT13(in_stack_fffffffffffffb9b,
                                                CONCAT12(in_stack_fffffffffffffb9a,
                                                         CONCAT11(in_stack_fffffffffffffb99,
                                                                  in_stack_fffffffffffffb98))),
                                       in_stack_fffffffffffffb94), !bVar1)) {
      __assert_fail("checkPixels<half>(hData, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                    ,0x3a9,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1c21d4);
    Imf_2_5::InputFile::~InputFile
              ((InputFile *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    break;
  case 1:
    vVar16 = local_c8;
    std::__cxx11::string::c_str();
    iVar14 = Imf_2_5::globalThreadCount();
    Imf_2_5::TiledInputFile::TiledInputFile
              ((TiledInputFile *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4);
    Imf_2_5::TiledInputFile::numXLevels(&local_128);
    Imf_2_5::TiledInputFile::numYLevels(&local_128);
    random_int(in_stack_fffffffffffffb84);
    random_int(in_stack_fffffffffffffb84);
    Imf_2_5::TiledInputFile::levelWidth
              ((TiledInputFile *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
    Imf_2_5::TiledInputFile::levelHeight
              ((TiledInputFile *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
    Imf_2_5::TiledInputFile::numXTiles
              ((TiledInputFile *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
    Imf_2_5::TiledInputFile::numYTiles
              ((TiledInputFile *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
    local_12c = random_int(in_stack_fffffffffffffb84);
    local_130 = random_int(in_stack_fffffffffffffb84);
    local_134 = random_int(in_stack_fffffffffffffb84);
    local_138 = random_int(in_stack_fffffffffffffb84);
    if (local_130 < local_12c) {
      std::swap<int>(&local_12c,&local_130);
    }
    if (local_138 < local_134) {
      std::swap<int>(&local_134,&local_138);
    }
    Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1c2491);
    setInputFrameBuffer((FrameBuffer *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)
                        ,iVar4,(Array2D<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                        (Array2D<float> *)in_stack_fffffffffffffc68,
                        (Array2D<half> *)
                        CONCAT44(in_stack_fffffffffffffc64,
                                 CONCAT13(in_stack_fffffffffffffc63,
                                          CONCAT12(in_stack_fffffffffffffc62,
                                                   CONCAT11(in_stack_fffffffffffffc61,
                                                            in_stack_fffffffffffffc60)))),iVar14,
                        vVar16);
    Imf_2_5::TiledInputFile::setFrameBuffer(in_stack_00000060,in_stack_00000058);
    Imf_2_5::TiledInputFile::readTiles
              ((TiledInputFile *)in_stack_00000160,in_stack_0000015c,in_stack_00000158,
               in_stack_00000154,in_stack_00000150,in_stack_0000014c,in_stack_00000170);
    Imf_2_5::TiledInputFile::dataWindowForTile
              ((TiledInputFile *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd84,in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
               in_stack_fffffffffffffd78);
    Imf_2_5::TiledInputFile::dataWindowForTile
              ((TiledInputFile *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd84,in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
               in_stack_fffffffffffffd78);
    if (local_c4 == 0) {
      bVar1 = checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffb9c,
                                  CONCAT13(in_stack_fffffffffffffb9b,
                                           CONCAT12(in_stack_fffffffffffffb9a,
                                                    CONCAT11(in_stack_fffffffffffffb99,
                                                             in_stack_fffffffffffffb98)))),
                         in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                         in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb84);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int>(uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                      ,0x3d8,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (local_c4 == 1) {
      bVar1 = checkPixels<float>((Array2D<float> *)
                                 CONCAT44(in_stack_fffffffffffffb9c,
                                          CONCAT13(in_stack_fffffffffffffb9b,
                                                   CONCAT12(in_stack_fffffffffffffb9a,
                                                            CONCAT11(in_stack_fffffffffffffb99,
                                                                     in_stack_fffffffffffffb98)))),
                                 in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                                 in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
                                 in_stack_fffffffffffffb84);
      if (!bVar1) {
        __assert_fail("checkPixels<float>(fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                      ,0x3dc,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((local_c4 == 2) &&
            (bVar1 = checkPixels<half>((Array2D<half> *)
                                       CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                                       ,in_stack_fffffffffffffba4,in_stack_fffffffffffffba0,
                                       in_stack_fffffffffffffb9c,
                                       CONCAT13(in_stack_fffffffffffffb9b,
                                                CONCAT12(in_stack_fffffffffffffb9a,
                                                         CONCAT11(in_stack_fffffffffffffb99,
                                                                  in_stack_fffffffffffffb98))),
                                       in_stack_fffffffffffffb94), !bVar1)) {
      __assert_fail("checkPixels<half>(hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                    ,0x3e0,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1c2746);
    Imf_2_5::TiledInputFile::~TiledInputFile
              ((TiledInputFile *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    break;
  case 2:
    vVar16 = local_c8;
    std::__cxx11::string::c_str();
    Imf_2_5::globalThreadCount();
    Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile
              (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64
              );
    Imf_2_5::DeepFrameBuffer::DeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    Imf_2_5::Array2D<unsigned_int>::resizeErase
              ((Array2D<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               CONCAT44(in_stack_fffffffffffffb9c,
                        CONCAT13(in_stack_fffffffffffffb9b,
                                 CONCAT12(in_stack_fffffffffffffb9a,
                                          CONCAT11(in_stack_fffffffffffffb99,
                                                   in_stack_fffffffffffffb98)))),
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_c0,0);
    iVar14 = 0;
    Imf_2_5::Slice::Slice
              ((Slice *)&stack0xfffffffffffffda8,UINT,(char *)puVar13,4,0x304,1,1,0.0,false,false);
    Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (Slice *)CONCAT44(in_stack_fffffffffffffb8c,iVar14));
    setInputDeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               iVar4,(Array2D<unsigned_int_*> *)
                     CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,
               (Array2D<half_*> *)
               CONCAT44(in_stack_fffffffffffffc64,
                        CONCAT13(in_stack_fffffffffffffc63,
                                 CONCAT12(in_stack_fffffffffffffc62,
                                          CONCAT11(in_stack_fffffffffffffc61,
                                                   in_stack_fffffffffffffc60)))),
               in_stack_fffffffffffffc5c,vVar16);
    Imf_2_5::DeepScanLineInputFile::setFrameBuffer(in_stack_00000038,in_stack_00000030);
    iVar4 = random_int(in_stack_fffffffffffffb84);
    local_260 = random_int(in_stack_fffffffffffffb84);
    if (local_260 < iVar4) {
      std::swap<int>((int *)&stack0xfffffffffffffda4,&local_260);
    }
    Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts
              ((DeepScanLineInputFile *)
               CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               in_stack_fffffffffffffdac,in_stack_fffffffffffffda8);
    bVar1 = checkSampleCount((Array2D<unsigned_int> *)
                             CONCAT44(in_stack_fffffffffffffb9c,
                                      CONCAT13(in_stack_fffffffffffffb9b,
                                               CONCAT12(in_stack_fffffffffffffb9a,
                                                        CONCAT11(in_stack_fffffffffffffb99,
                                                                 in_stack_fffffffffffffb98)))),
                             in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                             in_stack_fffffffffffffb8c,iVar14,in_stack_fffffffffffffb84);
    if (!bVar1) {
      __assert_fail("checkSampleCount(sampleCount, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                    ,0x3fd,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    allocatePixels(in_stack_fffffffffffffbc4,
                   (Array2D<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                   (Array2D<unsigned_int_*> *)
                   CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                   ,(Array2D<half_*> *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)
                   ,in_stack_fffffffffffffb9c,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbd8,
                   in_stack_fffffffffffffbe0);
    Imf_2_5::DeepScanLineInputFile::readPixels
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8);
    if (local_c4 == 0) {
      bVar1 = checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                         (Array2D<unsigned_int_*> *)
                         CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                         in_stack_fffffffffffffb9c,
                         CONCAT13(in_stack_fffffffffffffb9b,
                                  CONCAT12(in_stack_fffffffffffffb9a,
                                           CONCAT11(in_stack_fffffffffffffb99,
                                                    in_stack_fffffffffffffb98))),
                         in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                         in_stack_fffffffffffffbc0);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, 0, width - 1, l1, l2, width)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                      ,0x407,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (local_c4 == 1) {
      bVar1 = checkPixels<float>((Array2D<unsigned_int> *)
                                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                                 (Array2D<float_*> *)
                                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                 in_stack_fffffffffffffb9c,
                                 CONCAT13(in_stack_fffffffffffffb9b,
                                          CONCAT12(in_stack_fffffffffffffb9a,
                                                   CONCAT11(in_stack_fffffffffffffb99,
                                                            in_stack_fffffffffffffb98))),
                                 in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                                 in_stack_fffffffffffffbc0);
      if (!bVar1) {
        __assert_fail("checkPixels<float>(sampleCount, deepFData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                      ,0x40a,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((local_c4 == 2) &&
            (bVar1 = checkPixels<half>((Array2D<unsigned_int> *)
                                       CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                                       ,(Array2D<half_*> *)
                                        CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0
                                                ),in_stack_fffffffffffffb9c,
                                       CONCAT13(in_stack_fffffffffffffb9b,
                                                CONCAT12(in_stack_fffffffffffffb9a,
                                                         CONCAT11(in_stack_fffffffffffffb99,
                                                                  in_stack_fffffffffffffb98))),
                                       in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                                       in_stack_fffffffffffffbc0), !bVar1)) {
      __assert_fail("checkPixels<half>(sampleCount, deepHData, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                    ,0x40d,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    in_stack_fffffffffffffb80 = local_260;
    releasePixels(in_stack_fffffffffffffbb4,
                  (Array2D<unsigned_int_*> *)
                  CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                  (Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                  (Array2D<half_*> *)
                  CONCAT44(in_stack_fffffffffffffb9c,
                           CONCAT13(in_stack_fffffffffffffb9b,
                                    CONCAT12(in_stack_fffffffffffffb9a,
                                             CONCAT11(in_stack_fffffffffffffb99,
                                                      in_stack_fffffffffffffb98)))),
                  in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,in_stack_fffffffffffffbc0,
                  in_stack_fffffffffffffbc8);
    Imf_2_5::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1c2bd8);
    Imf_2_5::DeepScanLineInputFile::~DeepScanLineInputFile
              ((DeepScanLineInputFile *)
               CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    break;
  case 3:
    vVar16 = local_c8;
    y1 = std::__cxx11::string::c_str();
    Imf_2_5::globalThreadCount();
    Imf_2_5::DeepTiledInputFile::DeepTiledInputFile
              ((DeepTiledInputFile *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
               in_stack_fffffffffffffda4);
    iVar5 = Imf_2_5::DeepTiledInputFile::numXLevels(&local_270);
    x2 = Imf_2_5::DeepTiledInputFile::numYLevels(&local_270);
    iVar17 = x2;
    random_int(in_stack_fffffffffffffb84);
    y2 = random_int(in_stack_fffffffffffffb84);
    iVar6 = Imf_2_5::DeepTiledInputFile::levelWidth
                      (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
    iVar14 = iVar6;
    width = Imf_2_5::DeepTiledInputFile::levelHeight
                      (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
    iVar7 = Imf_2_5::DeepTiledInputFile::numXTiles
                      (in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
    iVar8 = Imf_2_5::DeepTiledInputFile::numYTiles
                      (in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
    type = random_int(in_stack_fffffffffffffb84);
    dx = type;
    iVar9 = random_int(in_stack_fffffffffffffb84);
    dy = iVar9;
    iVar10 = random_int(in_stack_fffffffffffffb84);
    iVar3 = iVar10;
    iVar11 = random_int(in_stack_fffffffffffffb84);
    iVar2 = iVar11;
    if (dy < dx) {
      std::swap<int>((int *)&stack0xfffffffffffffd84,(int *)&stack0xfffffffffffffd80);
    }
    if (iVar2 < iVar3) {
      std::swap<int>((int *)&stack0xfffffffffffffd7c,(int *)&stack0xfffffffffffffd78);
    }
    Imf_2_5::DeepFrameBuffer::DeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    Imf_2_5::Array2D<unsigned_int>::resizeErase
              ((Array2D<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               CONCAT44(in_stack_fffffffffffffb9c,
                        CONCAT13(in_stack_fffffffffffffb9b,
                                 CONCAT12(in_stack_fffffffffffffb9a,
                                          CONCAT11(in_stack_fffffffffffffb99,
                                                   in_stack_fffffffffffffb98)))),
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    t = UINT;
    puVar13 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_c0,0);
    y2_00 = 0;
    Imf_2_5::Slice::Slice(local_340,t,(char *)puVar13,4,(long)iVar6 << 2,1,1,0.0,false,false);
    Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (Slice *)CONCAT44(in_stack_fffffffffffffb8c,y2_00));
    setInputDeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               iVar4,(Array2D<unsigned_int_*> *)
                     CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,
               (Array2D<half_*> *)
               CONCAT44(in_stack_fffffffffffffc64,
                        CONCAT13(in_stack_fffffffffffffc63,
                                 CONCAT12(in_stack_fffffffffffffc62,
                                          CONCAT11(in_stack_fffffffffffffc61,
                                                   in_stack_fffffffffffffc60)))),
               in_stack_fffffffffffffc5c,vVar16);
    Imf_2_5::DeepTiledInputFile::setFrameBuffer
              ((DeepTiledInputFile *)in_stack_00000030,in_stack_00000028);
    Imf_2_5::DeepTiledInputFile::readPixelSampleCounts
              (in_stack_00000b68,in_stack_00000b64,in_stack_00000b60,in_stack_00000b5c,
               in_stack_00000b58,in_stack_00000b54,in_stack_00000b80);
    Imf_2_5::DeepTiledInputFile::dataWindowForTile
              ((DeepTiledInputFile *)CONCAT44(iVar5,iVar17),dx,dy,iVar3,iVar2);
    Imf_2_5::DeepTiledInputFile::dataWindowForTile
              ((DeepTiledInputFile *)CONCAT44(iVar5,iVar17),dx,dy,iVar3,iVar2);
    bVar1 = checkSampleCount((Array2D<unsigned_int> *)
                             CONCAT44(in_stack_fffffffffffffb9c,
                                      CONCAT13(in_stack_fffffffffffffb9b,
                                               CONCAT12(in_stack_fffffffffffffb9a,
                                                        CONCAT11(in_stack_fffffffffffffb99,
                                                                 in_stack_fffffffffffffb98)))),
                             in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                             in_stack_fffffffffffffb8c,y2_00,in_stack_fffffffffffffb84);
    uVar15 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffba0);
    if (!bVar1) {
      __assert_fail("checkSampleCount(sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                    ,0x43e,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    allocatePixels(iVar14,(Array2D<unsigned_int> *)CONCAT44(iVar7,iVar8),
                   (Array2D<unsigned_int_*> *)CONCAT44(type,iVar9),
                   (Array2D<float_*> *)CONCAT44(iVar10,iVar11),(Array2D<half_*> *)CONCAT44(t,uVar15)
                   ,in_stack_fffffffffffffb9c,x2,y1,in_stack_fffffffffffffbe0);
    Imf_2_5::DeepTiledInputFile::readTiles
              (in_stack_00000160,in_stack_0000015c,in_stack_00000158,in_stack_00000154,
               in_stack_00000150,in_stack_0000014c,in_stack_00000170);
    iVar4 = local_c4;
    if (local_c4 == 0) {
      in_stack_fffffffffffffb9b =
           checkPixels<unsigned_int>
                     ((Array2D<unsigned_int> *)CONCAT44(iVar10,iVar11),
                      (Array2D<unsigned_int_*> *)CONCAT44(t,uVar15),0,
                      CONCAT13(in_stack_fffffffffffffb9b,
                               CONCAT12(in_stack_fffffffffffffb9a,
                                        CONCAT11(in_stack_fffffffffffffb99,in_stack_fffffffffffffb98
                                                ))),in_stack_fffffffffffffb94,
                      in_stack_fffffffffffffb90,width);
      if (!(bool)in_stack_fffffffffffffb9b) {
        __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                      ,0x44a,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (local_c4 == 1) {
      in_stack_fffffffffffffb9a =
           checkPixels<float>((Array2D<unsigned_int> *)CONCAT44(iVar10,iVar11),
                              (Array2D<float_*> *)CONCAT44(t,uVar15),1,
                              CONCAT13(in_stack_fffffffffffffb9b,
                                       CONCAT12(in_stack_fffffffffffffb9a,
                                                CONCAT11(in_stack_fffffffffffffb99,
                                                         in_stack_fffffffffffffb98))),
                              in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,width);
      if (!(bool)in_stack_fffffffffffffb9a) {
        __assert_fail("checkPixels<float>(sampleCount, deepFData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                      ,0x44e,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((local_c4 == 2) &&
            (in_stack_fffffffffffffb99 =
                  checkPixels<half>((Array2D<unsigned_int> *)CONCAT44(iVar10,iVar11),
                                    (Array2D<half_*> *)CONCAT44(t,uVar15),2,
                                    CONCAT13(in_stack_fffffffffffffb9b,
                                             CONCAT12(in_stack_fffffffffffffb9a,
                                                      CONCAT11(in_stack_fffffffffffffb99,
                                                               in_stack_fffffffffffffb98))),
                                    in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,width),
            !(bool)in_stack_fffffffffffffb99)) {
      __assert_fail("checkPixels<half>(sampleCount, deepHData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                    ,0x452,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    releasePixels(type,(Array2D<unsigned_int_*> *)CONCAT44(iVar10,iVar11),
                  (Array2D<float_*> *)CONCAT44(t,uVar15),
                  (Array2D<half_*> *)
                  CONCAT44(iVar4,CONCAT13(in_stack_fffffffffffffb9b,
                                          CONCAT12(in_stack_fffffffffffffb9a,
                                                   CONCAT11(in_stack_fffffffffffffb99,
                                                            in_stack_fffffffffffffb98)))),
                  in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,width,y2);
    Imf_2_5::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1c32d2);
    Imf_2_5::DeepTiledInputFile::~DeepTiledInputFile((DeepTiledInputFile *)CONCAT44(type,iVar9));
    in_stack_fffffffffffffb80 = local_354;
  }
  Imf_2_5::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80))
  ;
  Imf_2_5::Array2D<half_*>::~Array2D
            ((Array2D<half_*> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  Imf_2_5::Array2D<float_*>::~Array2D
            ((Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  Imf_2_5::Array2D<unsigned_int_*>::~Array2D
            ((Array2D<unsigned_int_*> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  Imf_2_5::Array2D<half>::~Array2D
            ((Array2D<half> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  Imf_2_5::Array2D<float>::~Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  Imf_2_5::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80))
  ;
  return;
}

Assistant:

void
readFirstPart (const std::string & fn)
{
    Array2D<unsigned int> uData;
    Array2D<float> fData;
    Array2D<half> hData;
    
    Array2D<unsigned int*> deepUData;
    Array2D<float*> deepFData;
    Array2D<half*> deepHData;
    
    Array2D<unsigned int> sampleCount;
    
    cout << "Reading first part " << flush;
    int pixelType = pixelTypes[0];
    int partType = partTypes[0];
    int levelMode = levelModes[0];
    switch (partType)
    {
        case 0:
        {
            InputFile part (fn.c_str());

            int l1, l2;
            l1 = random_int(height);
            l2 = random_int(height);
            if (l1 > l2) swap(l1, l2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer(frameBuffer, pixelType,
                                uData, fData, hData, width, height);

            part.setFrameBuffer(frameBuffer);
            part.readPixels(l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert(checkPixels<unsigned int>(uData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert(checkPixels<float>(fData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert(checkPixels<half>(hData, 0, width - 1, l1, l2, width));
                    break;
            }

            break;
        }
        case 1:
        {
            TiledInputFile part(fn.c_str());

            int tx1, tx2, ty1, ty2;
            int lx, ly;


            int numXLevels = part.numXLevels();
            int numYLevels = part.numYLevels();

            lx = random_int(numXLevels);
            ly = random_int(numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth(lx);
            int h = part.levelHeight(ly);

            int numXTiles = part.numXTiles(lx);
            int numYTiles = part.numYTiles(ly);
            tx1 = random_int(numXTiles);
            tx2 = random_int(numXTiles);
            ty1 = random_int(numYTiles);
            ty2 = random_int(numYTiles);
            if (tx1 > tx2) swap(tx1, tx2);
            if (ty1 > ty2) swap(ty1, ty2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer(frameBuffer, pixelType,
                                uData, fData, hData, w, h);

            part.setFrameBuffer(frameBuffer);
            part.readTiles(tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile(tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile(tx2, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert(checkPixels<unsigned int>(uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                            w));
                    break;
                case 1:
                    assert(checkPixels<float>(fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                            w));
                    break;
                case 2:
                    assert(checkPixels<half>(hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                            w));
                    break;
            }

            break;
        }
        case 2:
        {
            DeepScanLineInputFile part (fn.c_str());

            DeepFrameBuffer frameBuffer;

            sampleCount.resizeErase(height, width);
            frameBuffer.insertSampleCountSlice (Slice (OPENEXR_IMF_NAMESPACE::UINT,
                    (char *) (&sampleCount[0][0]),
                    sizeof (unsigned int) * 1,
                    sizeof (unsigned int) * width));

            setInputDeepFrameBuffer(frameBuffer, pixelType,
                                    deepUData, deepFData, deepHData, width, height);

            part.setFrameBuffer(frameBuffer);

            int l1, l2;
            l1 = random_int(height);
            l2 = random_int(height);
            if (l1 > l2) swap(l1, l2);

            part.readPixelSampleCounts(l1, l2);
            assert(checkSampleCount(sampleCount, 0, width - 1, l1, l2, width));

            allocatePixels(pixelType, sampleCount,
                           deepUData, deepFData, deepHData, 0, width - 1, l1, l2);

            part.readPixels(l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert(checkPixels<unsigned int>(sampleCount, deepUData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert(checkPixels<float>(sampleCount, deepFData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert(checkPixels<half>(sampleCount, deepHData, 0, width - 1, l1, l2, width));
                    break;
            }

            releasePixels(pixelType, deepUData, deepFData, deepHData, 0, width - 1, l1, l2);

            break;
        }
        case 3:
        {
            DeepTiledInputFile part (fn.c_str());
            int numXLevels = part.numXLevels();
            int numYLevels = part.numYLevels();

            int tx1, tx2, ty1, ty2;
            int lx, ly;
            lx = random_int(numXLevels);
            ly = random_int(numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth(lx);
            int h = part.levelHeight(ly);

            int numXTiles = part.numXTiles(lx);
            int numYTiles = part.numYTiles(ly);
            tx1 = random_int(numXTiles);
            tx2 = random_int(numXTiles);
            ty1 = random_int(numYTiles);
            ty2 = random_int(numYTiles);
            if (tx1 > tx2) swap(tx1, tx2);
            if (ty1 > ty2) swap(ty1, ty2);

            DeepFrameBuffer frameBuffer;

            sampleCount.resizeErase(h, w);
            frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                    (char *) (&sampleCount[0][0]),
                    sizeof (unsigned int) * 1,
                    sizeof (unsigned int) * w));

            setInputDeepFrameBuffer(frameBuffer, pixelType,
                                    deepUData, deepFData, deepHData, w, h);

            part.setFrameBuffer(frameBuffer);

            part.readPixelSampleCounts(tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile(tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile(tx2, ty2, lx, ly);
            assert(checkSampleCount(sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));

            allocatePixels(pixelType, sampleCount,
                           deepUData, deepFData, deepHData,
                           b1.min.x, b2.max.x, b1.min.y, b2.max.y);

            part.readTiles(tx1, tx2, ty1, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert(checkPixels<unsigned int>(sampleCount, deepUData,
                            b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 1:
                    assert(checkPixels<float>(sampleCount, deepFData,
                            b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 2:
                    assert(checkPixels<half>(sampleCount, deepHData,
                            b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
            }

            releasePixels(pixelType, deepUData, deepFData, deepHData,
                          b1.min.x, b2.max.x, b1.min.y, b2.max.y);

            break;
        }
    }
}